

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testNNValidatorReshape4D(void)

{
  RepeatedField<long> *pRVar1;
  WeightParams **this;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Rep *pRVar5;
  ulong uVar6;
  InnerProductLayerParams *pIVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  ReshapeLayerParams *pRVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar20;
  Arena *pAVar21;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar5 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_0018a9b6:
    pRVar19 = &(MStack_78.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar2 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_0018a9b6;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar15 = pRVar5->elements[iVar2];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"input",puVar18);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar21);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar3] = 1;
  pRVar1->current_size_ = uVar3 + 1;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar5 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_0018aac8:
    pRVar19 = &(MStack_78.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar2 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_0018aac8;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar15 = pRVar5->elements[iVar2];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"output",puVar18);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar21);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar3] = 1;
  pRVar1->current_size_ = uVar3 + 1;
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  pRVar5 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_0018abec:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar13);
  }
  else {
    iVar2 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_0018abec;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar2 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar5->elements[iVar2];
  }
  pRVar5 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_0018ac24:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar2 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_0018ac24;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar15 = pRVar5->elements[iVar2];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3cb973);
  pRVar5 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    iVar2 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar5->allocated_size) {
      (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pvVar15 = pRVar5->elements[iVar2];
      goto LAB_0018ac8e;
    }
  }
  pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
LAB_0018ac8e:
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3dece7);
  if (pNVar13->_oneof_case_[0] != 300) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 300;
    uVar6 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pRVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ReshapeLayerParams>
                        (pAVar21);
    (pNVar13->layer_).reshape_ = pRVar16;
  }
  pIVar7 = (pNVar13->layer_).innerproduct_;
  this = &pIVar7->weights_;
  uVar3 = *(uint *)&pIVar7->weights_;
  uVar4 = *(uint *)((long)&pIVar7->weights_ + 4);
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar11[uVar3] = 1;
  uVar20 = uVar3 + 1;
  *(uint *)&pIVar7->weights_ = uVar20;
  uVar4 = *(uint *)((long)&pIVar7->weights_ + 4);
  if (uVar20 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar11[uVar20] = 1;
  uVar20 = uVar3 + 2;
  *(uint *)&pIVar7->weights_ = uVar20;
  uVar4 = *(uint *)((long)&pIVar7->weights_ + 4);
  if (uVar20 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar11[uVar20] = 1;
  uVar20 = uVar3 + 3;
  *(uint *)&pIVar7->weights_ = uVar20;
  uVar4 = *(uint *)((long)&pIVar7->weights_ + 4);
  if (uVar20 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar11[uVar20] = 1;
  *(uint *)&pIVar7->weights_ = uVar3 + 4;
  *(undefined4 *)((long)&pIVar7->inputchannels_ + 4) = 0;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar8 = CoreML::Result::good(&local_48);
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,900);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)!bVar8;
}

Assistant:

int testNNValidatorReshape4D() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *reshapeLayer = nn->add_layers();
    reshapeLayer->add_input("input");
    reshapeLayer->add_output("output");
    Specification::ReshapeLayerParams *reshapeParams = reshapeLayer->mutable_reshape();

    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);

    reshapeParams->set_mode(::CoreML::Specification::ReshapeLayerParams_ReshapeOrder::ReshapeLayerParams_ReshapeOrder_CHANNEL_FIRST); Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}